

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O1

void __thiscall
MxxSort_SampleSortInbalanced_Test::~MxxSort_SampleSortInbalanced_Test
          (MxxSort_SampleSortInbalanced_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxSort, SampleSortInbalanced) {
    mxx::comm c;
    srand(c.rank()*13);
    std::vector<std::pair<int,int> > vec(10 + c.rank()*3);

    std::generate(vec.begin(), vec.end(), [](){return std::make_pair(std::rand(), std::rand());});

    // comparator for sorting
    auto paircmp = [](const std::pair<int,int>& x, const std::pair<int, int>& y){
        return x.first < y.first || (x.first == y.first && x.second < y.second);
    };

    // send all elements to master and sort there as "groud-truth"
    std::vector<std::pair<int, int>> truth = mxx::gatherv(vec, 0, c);
    if (c.rank() == 0)
        std::sort(truth.begin(), truth.end(), paircmp);

    // distributed sort
    mxx::sort(vec.begin(), vec.end(), paircmp, c);

    // send to rank 0
    std::vector<std::pair<int,int>> allsorted = mxx::gatherv(vec, 0, c);

    // should be sorted locally
    ASSERT_TRUE(std::is_sorted(vec.begin(), vec.end(), paircmp));
    // should be sorted globally
    ASSERT_TRUE(mxx::is_sorted(vec.begin(), vec.end(), paircmp, c));

    // on rank 0, vectors should be the same
    if (c.rank() == 0) {
        ASSERT_EQ(truth.size(), allsorted.size());
        for (size_t i = 0; i < truth.size(); ++i) {
            EXPECT_EQ(truth[i].first, allsorted[i].first);
            EXPECT_EQ(truth[i].second, allsorted[i].second);
        }
    }
}